

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O0

int __thiscall TinyProcessLib::Process::open(Process *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  __pid_t _Var3;
  pointer piVar4;
  long lVar5;
  type piVar6;
  int local_5c;
  int fd;
  int fd_max;
  id_type pid;
  int stderr_p [2];
  int stdout_p [2];
  int stdin_p [2];
  unique_ptr<int,_std::default_delete<int>_> local_30;
  unique_ptr<int,_std::default_delete<int>_> local_28;
  function<void_()> *local_20;
  function<void_()> *function_local;
  Process *this_local;
  
  local_20 = (function<void_()> *)__file;
  function_local = (function<void_()> *)this;
  if ((this->open_stdin & 1U) != 0) {
    piVar4 = (pointer)operator_new(4);
    std::unique_ptr<int,std::default_delete<int>>::unique_ptr<std::default_delete<int>,void>
              ((unique_ptr<int,std::default_delete<int>> *)&local_28,piVar4);
    std::unique_ptr<int,_std::default_delete<int>_>::operator=(&this->stdin_fd,&local_28);
    std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&local_28);
  }
  bVar1 = std::function::operator_cast_to_bool((function *)&this->read_stdout);
  if (bVar1) {
    piVar4 = (pointer)operator_new(4);
    std::unique_ptr<int,std::default_delete<int>>::unique_ptr<std::default_delete<int>,void>
              ((unique_ptr<int,std::default_delete<int>> *)&local_30,piVar4);
    std::unique_ptr<int,_std::default_delete<int>_>::operator=(&this->stdout_fd,&local_30);
    std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&local_30);
  }
  bVar1 = std::function::operator_cast_to_bool((function *)&this->read_stderr);
  if (bVar1) {
    piVar4 = (pointer)operator_new(4);
    std::unique_ptr<int,std::default_delete<int>>::unique_ptr<std::default_delete<int>,void>
              ((unique_ptr<int,std::default_delete<int>> *)stdin_p,piVar4);
    std::unique_ptr<int,_std::default_delete<int>_>::operator=
              (&this->stderr_fd,(unique_ptr<int,_std::default_delete<int>_> *)stdin_p);
    std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
              ((unique_ptr<int,_std::default_delete<int>_> *)stdin_p);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdin_fd);
  if ((bVar1) && (iVar2 = pipe(stdout_p), iVar2 != 0)) {
    this_local._4_4_ = -1;
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdout_fd);
    if ((bVar1) && (iVar2 = pipe(stderr_p), iVar2 != 0)) {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdin_fd);
      if (bVar1) {
        close(stdout_p[0]);
        close(stdout_p[1]);
      }
      this_local._4_4_ = -1;
    }
    else {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stderr_fd);
      if ((bVar1) && (iVar2 = pipe(&fd_max), iVar2 != 0)) {
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdin_fd);
        if (bVar1) {
          close(stdout_p[0]);
          close(stdout_p[1]);
        }
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdout_fd);
        if (bVar1) {
          close(stderr_p[0]);
          close(stderr_p[1]);
        }
        this_local._4_4_ = -1;
      }
      else {
        _Var3 = fork();
        this_local._4_4_ = _Var3;
        if (_Var3 < 0) {
          bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdin_fd);
          if (bVar1) {
            close(stdout_p[0]);
            close(stdout_p[1]);
          }
          bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdout_fd);
          if (bVar1) {
            close(stderr_p[0]);
            close(stderr_p[1]);
          }
          bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stderr_fd);
          if (bVar1) {
            close(fd_max);
            close(pid);
          }
        }
        else {
          if (_Var3 == 0) {
            bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdin_fd);
            if (bVar1) {
              dup2(stdout_p[0],0);
            }
            bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdout_fd);
            if (bVar1) {
              dup2(stderr_p[1],1);
            }
            bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stderr_fd);
            if (bVar1) {
              dup2(pid,2);
            }
            bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdin_fd);
            if (bVar1) {
              close(stdout_p[0]);
              close(stdout_p[1]);
            }
            bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdout_fd);
            if (bVar1) {
              close(stderr_p[0]);
              close(stderr_p[1]);
            }
            bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stderr_fd);
            if (bVar1) {
              close(fd_max);
              close(pid);
            }
            if (((this->config).inherit_file_descriptors & 1U) == 0) {
              lVar5 = sysconf(4);
              for (local_5c = 3; local_5c < (int)lVar5; local_5c = local_5c + 1) {
                close(local_5c);
              }
            }
            setpgid(0,0);
            bVar1 = std::function::operator_cast_to_bool((function *)local_20);
            if (bVar1) {
              std::function<void_()>::operator()(local_20);
            }
            _exit(1);
          }
          bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdin_fd);
          if (bVar1) {
            close(stdout_p[0]);
          }
          bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdout_fd);
          if (bVar1) {
            close(stderr_p[1]);
          }
          bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stderr_fd);
          if (bVar1) {
            close(pid);
          }
          bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdin_fd);
          if (bVar1) {
            piVar6 = std::unique_ptr<int,_std::default_delete<int>_>::operator*(&this->stdin_fd);
            *piVar6 = stdout_p[1];
          }
          bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdout_fd);
          if (bVar1) {
            piVar6 = std::unique_ptr<int,_std::default_delete<int>_>::operator*(&this->stdout_fd);
            *piVar6 = stderr_p[0];
          }
          bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stderr_fd);
          if (bVar1) {
            piVar6 = std::unique_ptr<int,_std::default_delete<int>_>::operator*(&this->stderr_fd);
            *piVar6 = fd_max;
          }
          this->closed = false;
          (this->data).id = _Var3;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

Process::id_type Process::open(const std::function<void()> &function) noexcept {
  if(open_stdin)
    stdin_fd = std::unique_ptr<fd_type>(new fd_type);
  if(read_stdout)
    stdout_fd = std::unique_ptr<fd_type>(new fd_type);
  if(read_stderr)
    stderr_fd = std::unique_ptr<fd_type>(new fd_type);

  int stdin_p[2], stdout_p[2], stderr_p[2];

  if(stdin_fd && pipe(stdin_p) != 0)
    return -1;
  if(stdout_fd && pipe(stdout_p) != 0) {
    if(stdin_fd) {
      close(stdin_p[0]);
      close(stdin_p[1]);
    }
    return -1;
  }
  if(stderr_fd && pipe(stderr_p) != 0) {
    if(stdin_fd) {
      close(stdin_p[0]);
      close(stdin_p[1]);
    }
    if(stdout_fd) {
      close(stdout_p[0]);
      close(stdout_p[1]);
    }
    return -1;
  }

  id_type pid = fork();

  if(pid < 0) {
    if(stdin_fd) {
      close(stdin_p[0]);
      close(stdin_p[1]);
    }
    if(stdout_fd) {
      close(stdout_p[0]);
      close(stdout_p[1]);
    }
    if(stderr_fd) {
      close(stderr_p[0]);
      close(stderr_p[1]);
    }
    return pid;
  }
  else if(pid == 0) {
    if(stdin_fd)
      dup2(stdin_p[0], 0);
    if(stdout_fd)
      dup2(stdout_p[1], 1);
    if(stderr_fd)
      dup2(stderr_p[1], 2);
    if(stdin_fd) {
      close(stdin_p[0]);
      close(stdin_p[1]);
    }
    if(stdout_fd) {
      close(stdout_p[0]);
      close(stdout_p[1]);
    }
    if(stderr_fd) {
      close(stderr_p[0]);
      close(stderr_p[1]);
    }

    if(!config.inherit_file_descriptors) {
      int fd_max = static_cast<int>(sysconf(_SC_OPEN_MAX)); // truncation is safe
      // Based on http://stackoverflow.com/a/899533/3808293
      // TODO: find a way to optimize, as this is slow on systems with high fd_max
      for(int fd = 3; fd < fd_max; fd++)
        close(fd);
    }

    setpgid(0, 0);
    //TODO: See here on how to emulate tty for colors: http://stackoverflow.com/questions/1401002/trick-an-application-into-thinking-its-stdin-is-interactive-not-a-pipe
    //TODO: One solution is: echo "command;exit"|script -q /dev/null

    if(function)
      function();

    _exit(EXIT_FAILURE);
  }

  if(stdin_fd)
    close(stdin_p[0]);
  if(stdout_fd)
    close(stdout_p[1]);
  if(stderr_fd)
    close(stderr_p[1]);

  if(stdin_fd)
    *stdin_fd = stdin_p[1];
  if(stdout_fd)
    *stdout_fd = stdout_p[0];
  if(stderr_fd)
    *stderr_fd = stderr_p[0];

  closed = false;
  data.id = pid;
  return pid;
}